

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmodel.hpp
# Opt level: O0

bool __thiscall
QtMWidgets::ListModel<QImage>::moveRows
          (ListModel<QImage> *this,int sourceRow,int count,int destinationRow)

{
  ListModelPrivate<QImage> *pLVar1;
  ListModelPrivate<QImage> *pLVar2;
  qsizetype qVar3;
  qsizetype local_60;
  int local_44;
  int local_28;
  int i;
  int destinationRow_local;
  int count_local;
  int sourceRow_local;
  ListModel<QImage> *this_local;
  
  if (sourceRow == destinationRow) {
    this_local._7_1_ = false;
  }
  else {
    for (local_28 = 0; local_28 < count; local_28 = local_28 + 1) {
      pLVar1 = QScopedPointer<QtMWidgets::ListModelPrivate<QImage>,_QScopedPointerDeleter<QtMWidgets::ListModelPrivate<QImage>_>_>
               ::operator->(&this->d);
      if (destinationRow < sourceRow) {
        local_44 = local_28;
      }
      else {
        local_44 = 0;
      }
      pLVar2 = QScopedPointer<QtMWidgets::ListModelPrivate<QImage>,_QScopedPointerDeleter<QtMWidgets::ListModelPrivate<QImage>_>_>
               ::operator->(&this->d);
      qVar3 = QList<QImage>::size(&pLVar2->data);
      if (destinationRow + local_28 < qVar3) {
        local_60 = (qsizetype)(destinationRow + local_28);
      }
      else {
        pLVar2 = QScopedPointer<QtMWidgets::ListModelPrivate<QImage>,_QScopedPointerDeleter<QtMWidgets::ListModelPrivate<QImage>_>_>
                 ::operator->(&this->d);
        qVar3 = QList<QImage>::size(&pLVar2->data);
        local_60 = qVar3 + -1;
      }
      QList<QImage>::move(&pLVar1->data,(long)(sourceRow + local_44),local_60);
    }
    AbstractListModel::rowsMoved
              (&this->super_AbstractListModel,sourceRow,sourceRow + count + -1,destinationRow);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool moveRows( int sourceRow, int count, int destinationRow )
	{
		if( sourceRow == destinationRow )
			return false;

		for( int i = 0; i < count; ++i )
			d->data.move( sourceRow + ( sourceRow > destinationRow ? i : 0 ),
				( destinationRow + i < d->data.size() ? destinationRow + i : d->data.size() - 1 ) );

		emit rowsMoved( sourceRow, sourceRow + count - 1, destinationRow );

		return true;
	}